

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O2

void __thiscall
TPZTransfer<std::complex<double>_>::AddBlockNumbers
          (TPZTransfer<std::complex<double>_> *this,int row,TPZVec<int> *colnumbers)

{
  int *piVar1;
  int *piVar2;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  
  piVar1 = (this->fColPosition).fStore;
  if (piVar1[row] != -1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "TPZTransfer:SetBlocks called for an already defined row = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,row);
    std::endl<char,std::char_traits<char>>(poVar3);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Solvers/Multigrid/pztransfer.cpp"
               ,0x7d);
  }
  piVar1[row] = this->fColumnBlockLastUsed;
  iVar5 = (int)colnumbers->fNElements;
  (this->fNumberofColumnBlocks).fStore[row] = iVar5;
  ExpandColumnVectorEntries(this,iVar5);
  iVar5 = (int)colnumbers->fNElements + this->fColumnBlockLastUsed;
  piVar1 = colnumbers->fStore;
  piVar2 = (this->fColumnBlockNumber).super_TPZVec<int>.fStore;
  for (lVar4 = (long)this->fColumnBlockLastUsed; lVar4 < iVar5; lVar4 = lVar4 + 1) {
    piVar2[lVar4] = piVar1[lVar4 - this->fColumnBlockLastUsed];
  }
  this->fColumnBlockLastUsed = iVar5;
  return;
}

Assistant:

void TPZTransfer<TVar>::AddBlockNumbers(int row, TPZVec<int> &colnumbers){
	if(HasRowDefinition(row)) {
		cout << "TPZTransfer:SetBlocks called for an already defined row = " <<
		row << endl;
		DebugStop();
	}
	fColPosition[row] = fColumnBlockLastUsed;
	fNumberofColumnBlocks[row] = colnumbers.NElements();
	// will specify the sparsity pattern of row
	ExpandColumnVectorEntries(colnumbers.NElements());
	int ic= fColumnBlockLastUsed, lastic = ic+colnumbers.NElements();
	for(;ic < lastic; ic++) {
		fColumnBlockNumber[ic] = colnumbers[ic-fColumnBlockLastUsed];
	}
	fColumnBlockLastUsed = lastic;
}